

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaOP.cpp
# Opt level: O3

void __thiscall OmegaOP::algo(OmegaOP *this,vector<double,_std::allocator<double>_> *data)

{
  pointer pdVar1;
  pointer pdVar2;
  double **ppdVar3;
  ulong uVar4;
  ulong uVar5;
  uint u;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  double dVar10;
  uint local_64;
  Costs cost;
  uint local_5c;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  double local_40;
  double local_38;
  
  pdVar1 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar2 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_58 = (ulong)this->nbStates;
  Costs::Costs(&cost);
  ppdVar3 = preprocessing(this,data);
  this->S12P = ppdVar3;
  uVar9 = (int)((ulong)((long)pdVar1 - (long)pdVar2) >> 3) + 1;
  local_48 = (ulong)uVar9;
  local_64 = 2;
  if (2 < uVar9) {
    do {
      if (local_58 != 0) {
        local_50 = 0;
        do {
          local_5c = 1;
          uVar9 = 0;
          dVar10 = INFINITY;
          uVar7 = 0;
          if (1 < local_64) {
            uVar6 = 0;
            uVar8 = 0;
            uVar9 = 0;
            dVar10 = INFINITY;
            do {
              do {
                uVar4 = (ulong)local_5c;
                local_40 = this->Q[uVar6][uVar4];
                ppdVar3 = this->S12P;
                uVar5 = (ulong)local_64;
                local_38 = dVar10;
                dVar10 = Costs::slopeCost(&cost,this->states + uVar6,this->states + local_50,
                                          &local_5c,&local_64,*ppdVar3 + uVar4,*ppdVar3 + uVar5,
                                          ppdVar3[1] + uVar4,ppdVar3[1] + uVar5,ppdVar3[2] + uVar4,
                                          ppdVar3[2] + uVar5);
                dVar10 = dVar10 + local_40 + this->penalty;
                if (dVar10 < local_38) {
                  uVar8 = uVar6 & 0xffffffff;
                  uVar9 = local_5c;
                }
                uVar7 = (uint)uVar8;
                if (local_38 <= dVar10) {
                  dVar10 = local_38;
                }
                uVar6 = uVar6 + 1;
              } while (uVar6 != local_58);
              local_5c = local_5c + 1;
              uVar6 = 0;
            } while (local_5c < local_64);
          }
          this->Q[local_50][local_64] = dVar10;
          this->lastChpt[local_50][local_64] = uVar9;
          this->lastIndState[local_50][local_64] = uVar7;
          local_50 = local_50 + 1;
        } while (local_50 != local_58);
      }
      local_64 = local_64 + 1;
    } while (local_64 < (uint)local_48);
  }
  this->pruning = 1.0;
  return;
}

Assistant:

void OmegaOP::algo(std::vector< double >& data)
{
  unsigned int n = data.size();
  unsigned int p = nbStates;
  Costs cost;
  double temp_cost = 0;
  double temp_Q = -1;
  int temp_chpt = -1;
  unsigned int temp_indState = 0;

  /// PREPROCESSING
  S12P = preprocessing(data);

  ///
  /// ALGO
  /// states u to v -> time position t to T
  /// explore in (u,t) for fixed (v,T)
  ///
  for(unsigned int T = 2; T < (n + 1); T++)
  {
    for(unsigned int v = 0; v < p; v++)
    {
      ///// EXPLORE MATRIX size p*T
      temp_Q = INFINITY;
      temp_indState = 0;
      temp_chpt = 0;

      for(unsigned int t = 1; t < T; t++)
      {
        for(unsigned int u = 0; u < p; u++) /////explore column of states
        {
          temp_cost = Q[u][t] + cost.slopeCost(states[u], states[v], t, T, S12P[0][t], S12P[0][T], S12P[1][t], S12P[1][T], S12P[2][t], S12P[2][T]) + penalty;
          //std::cout <<" t2 "<<  t << " v2 " << states[u] << " t3 "<< T <<" v3 " << states[v] << " cost  " << temp_cost;
          if(temp_Q > temp_cost)
          {
            temp_Q = temp_cost;
            temp_indState = u;
            temp_chpt = t;
          }
          //std::cout << std::endl;
        }

      }
      ///// Write response
      Q[v][T] = temp_Q;
      lastChpt[v][T] = temp_chpt;
      lastIndState[v][T] = temp_indState;
    }
  }
  pruning = 1;

}